

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Comm_split_type
              (MPIABI_Comm comm,int split_type,int key,MPIABI_Info info,MPIABI_Comm *newcomm)

{
  int iVar1;
  int iVar2;
  ompi_communicator_t *poVar3;
  ompi_info_t *poVar4;
  ompi_communicator_t **ppoVar5;
  WPI_HandlePtr<ompi_communicator_t_*> local_40;
  WPI_Handle local_38 [8];
  WPI_Handle local_30 [8];
  MPIABI_Comm *local_28;
  MPIABI_Comm *newcomm_local;
  MPIABI_Info info_local;
  int key_local;
  int split_type_local;
  MPIABI_Comm comm_local;
  
  local_28 = newcomm;
  newcomm_local = (MPIABI_Comm *)info;
  info_local._0_4_ = key;
  info_local._4_4_ = split_type;
  _key_local = comm;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle((WPI_Handle<ompi_communicator_t_*> *)local_30,comm);
  poVar3 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_30);
  iVar1 = info_local._4_4_;
  iVar2 = (int)info_local;
  WPI_Handle<ompi_info_t_*>::WPI_Handle
            ((WPI_Handle<ompi_info_t_*> *)local_38,(uintptr_t)newcomm_local);
  poVar4 = WPI_Handle::operator_cast_to_ompi_info_t_(local_38);
  WPI_HandlePtr<ompi_communicator_t_*>::WPI_HandlePtr(&local_40,local_28);
  ppoVar5 = WPI_HandlePtr::operator_cast_to_ompi_communicator_t__((WPI_HandlePtr *)&local_40);
  iVar2 = MPI_Comm_split_type(poVar3,iVar1,iVar2,poVar4,ppoVar5);
  WPI_HandlePtr<ompi_communicator_t_*>::~WPI_HandlePtr(&local_40);
  return iVar2;
}

Assistant:

int MPIABI_Comm_split_type(
  MPIABI_Comm comm,
  int split_type,
  int key,
  MPIABI_Info info,
  MPIABI_Comm * newcomm
) {
  return MPI_Comm_split_type(
    (MPI_Comm)(WPI_Comm)comm,
    split_type,
    key,
    (MPI_Info)(WPI_Info)info,
    (MPI_Comm *)(WPI_CommPtr)newcomm
  );
}